

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::BitfieldInsertCase::getInputValues
          (BitfieldInsertCase *this,int numValues,void **values)

{
  deUint32 *dst;
  deUint32 *dst_00;
  long lVar1;
  long lVar2;
  deUint32 dVar3;
  DataType dataType;
  Precision precision_00;
  int max;
  int iVar4;
  int iVar5;
  char *str;
  const_reference pvVar6;
  int offset;
  int local_64;
  int bits;
  int valueNdx;
  int *inBits;
  int *inOffset;
  deUint32 *inInsert;
  deUint32 *inBase;
  int numBits;
  Precision precision;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  BitfieldInsertCase *this_local;
  
  rnd.m_rnd._8_8_ = values;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar3 ^ 0x12c2acff);
  pvVar6 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar6->varType);
  pvVar6 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar6->varType);
  max = anon_unknown_3::getShaderUintBitCount
                  ((this->super_IntegerFunctionCase).m_shaderType,precision_00);
  dst = *(deUint32 **)rnd.m_rnd._8_8_;
  dst_00 = *(deUint32 **)(rnd.m_rnd._8_8_ + 8);
  lVar1 = *(long *)(rnd.m_rnd._8_8_ + 0x10);
  lVar2 = *(long *)(rnd.m_rnd._8_8_ + 0x18);
  for (local_64 = 0; local_64 < numValues; local_64 = local_64 + 1) {
    iVar4 = de::Random::getInt((Random *)&precision,0,max);
    iVar5 = de::Random::getInt((Random *)&precision,0,max - iVar4);
    *(int *)(lVar1 + (long)local_64 * 4) = iVar5;
    *(int *)(lVar2 + (long)local_64 * 4) = iVar4;
  }
  anon_unknown_3::generateRandomInputData
            ((Random *)&precision,(this->super_IntegerFunctionCase).m_shaderType,dataType,
             precision_00,dst,numValues);
  anon_unknown_3::generateRandomInputData
            ((Random *)&precision,(this->super_IntegerFunctionCase).m_shaderType,dataType,
             precision_00,dst_00,numValues);
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0x12c2acff);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				numBits		= getShaderUintBitCount(m_shaderType, precision);
		deUint32*				inBase		= (deUint32*)values[0];
		deUint32*				inInsert	= (deUint32*)values[1];
		int*					inOffset	= (int*)values[2];
		int*					inBits		= (int*)values[3];

		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
		{
			const int bits		= rnd.getInt(0, numBits);
			const int offset	= rnd.getInt(0, numBits-bits);

			inOffset[valueNdx]	= offset;
			inBits[valueNdx]	= bits;
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, inBase, numValues);
		generateRandomInputData(rnd, m_shaderType, type, precision, inInsert, numValues);
	}